

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curramt.cpp
# Opt level: O3

int __thiscall
icu_63::CurrencyAmount::clone
          (CurrencyAmount *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Measure *this_00;
  
  this_00 = (Measure *)UMemory::operator_new((UMemory *)0x80,(size_t)__fn);
  if (this_00 != (Measure *)0x0) {
    Measure::Measure(this_00,&this->super_Measure);
    (this_00->super_UObject)._vptr_UObject = (_func_int **)&PTR__CurrencyAmount_003d6840;
  }
  return (int)this_00;
}

Assistant:

UObject* CurrencyAmount::clone() const {
    return new CurrencyAmount(*this);
}